

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal
                 (ZSTD_compressionParameters *cParams,ldmParams_t *ldmParams,int isStatic,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,size_t buffInSize,size_t buffOutSize
                 ,U64 pledgedSrcSize)

{
  ldmParams_t params;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  undefined8 in_stack_fffffffffffffee0;
  size_t local_118;
  size_t local_108;
  ulong local_f0;
  U64 local_e8;
  ulong local_e0;
  U64 local_d8;
  size_t neededSpace;
  size_t cctxSpace;
  size_t bufferSpace;
  size_t ldmSeqSpace;
  size_t maxNbLdmSeq;
  size_t ldmSpace;
  size_t matchStateSize;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t tokenSpace;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  size_t windowSize;
  size_t buffOutSize_local;
  size_t buffInSize_local;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder_local;
  int isStatic_local;
  ldmParams_t *ldmParams_local;
  ZSTD_compressionParameters *cParams_local;
  
  if ((ulong)(1L << ((byte)cParams->windowLog & 0x3f)) < pledgedSrcSize) {
    local_d8 = 1L << ((byte)cParams->windowLog & 0x3f);
  }
  else {
    local_d8 = pledgedSrcSize;
  }
  if (local_d8 == 0) {
    local_e0 = 1;
  }
  else {
    if ((ulong)(1L << ((byte)cParams->windowLog & 0x3f)) < pledgedSrcSize) {
      local_e8 = 1L << ((byte)cParams->windowLog & 0x3f);
    }
    else {
      local_e8 = pledgedSrcSize;
    }
    local_e0 = local_e8;
  }
  if (local_e0 < 0x20001) {
    local_f0 = local_e0;
  }
  else {
    local_f0 = 0x20000;
  }
  uVar5 = 4;
  if (cParams->minMatch == 3) {
    uVar5 = 3;
  }
  sVar6 = ZSTD_cwksp_alloc_size(local_f0 + 0x20);
  sVar7 = ZSTD_cwksp_aligned_alloc_size(local_f0 / uVar5 << 3);
  sVar8 = ZSTD_cwksp_alloc_size(local_f0 / uVar5);
  sVar9 = ZSTD_cwksp_alloc_size(0x19d8);
  sVar10 = ZSTD_cwksp_alloc_size(0x11f0);
  sVar11 = ZSTD_sizeof_matchState(cParams,useRowMatchFinder,0,1);
  uVar1 = ldmParams->bucketSizeLog;
  uVar2 = ldmParams->minMatchLength;
  uVar3 = ldmParams->hashRateLog;
  uVar4 = ldmParams->windowLog;
  params.minMatchLength = uVar4;
  params.bucketSizeLog = uVar3;
  params.hashLog = uVar2;
  params.enableLdm = uVar1;
  params.hashRateLog = (int)in_stack_fffffffffffffee0;
  params.windowLog = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  sVar12 = ZSTD_ldm_getTableSize(params);
  sVar13 = ZSTD_ldm_getMaxNbSeq(*ldmParams,local_f0);
  if (ldmParams->enableLdm == 0) {
    local_108 = 0;
  }
  else {
    local_108 = ZSTD_cwksp_aligned_alloc_size(sVar13 * 0xc);
  }
  sVar13 = ZSTD_cwksp_alloc_size(buffInSize);
  sVar14 = ZSTD_cwksp_alloc_size(buffOutSize);
  if (isStatic == 0) {
    local_118 = 0;
  }
  else {
    local_118 = ZSTD_cwksp_alloc_size(0xdf8);
  }
  return local_118 + sVar9 + sVar10 * 2 + sVar12 + local_108 + sVar11 + sVar6 + sVar7 + sVar8 * 3 +
         sVar13 + sVar14;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        const ZSTD_compressionParameters* cParams,
        const ldmParams_t* ldmParams,
        const int isStatic,
        const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
        const size_t buffInSize,
        const size_t buffOutSize,
        const U64 pledgedSrcSize)
{
    size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << cParams->windowLog), pledgedSrcSize));
    size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
    U32    const divider = (cParams->minMatch==3) ? 3 : 4;
    size_t const maxNbSeq = blockSize / divider;
    size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                            + ZSTD_cwksp_aligned_alloc_size(maxNbSeq * sizeof(seqDef))
                            + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
    size_t const entropySpace = ZSTD_cwksp_alloc_size(ENTROPY_WORKSPACE_SIZE);
    size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
    size_t const matchStateSize = ZSTD_sizeof_matchState(cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 0, /* forCCtx */ 1);

    size_t const ldmSpace = ZSTD_ldm_getTableSize(*ldmParams);
    size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(*ldmParams, blockSize);
    size_t const ldmSeqSpace = ldmParams->enableLdm ?
        ZSTD_cwksp_aligned_alloc_size(maxNbLdmSeq * sizeof(rawSeq)) : 0;


    size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize)
                             + ZSTD_cwksp_alloc_size(buffOutSize);

    size_t const cctxSpace = isStatic ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;

    size_t const neededSpace =
        cctxSpace +
        entropySpace +
        blockStateSpace +
        ldmSpace +
        ldmSeqSpace +
        matchStateSize +
        tokenSpace +
        bufferSpace;

    DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
    return neededSpace;
}